

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_rand.cpp
# Opt level: O3

void __thiscall crnlib::well512::seed(well512 *this,uint32 seed)

{
  uint i;
  long lVar1;
  uint uVar2;
  uint uVar3;
  
  uVar2 = seed ^ 0x7793c2aa;
  uVar2 = uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
  lVar1 = 0;
  do {
    uVar2 = uVar2 << 0x11 ^ uVar2;
    uVar2 = uVar2 >> 0xd ^ uVar2;
    uVar2 = uVar2 << 5 ^ uVar2;
    uVar3 = seed * 0x1001 + 0x7ed55d16;
    uVar3 = uVar3 >> 0x13 ^ uVar3 ^ 0xc761c23c;
    uVar3 = (uVar3 * 0x4200 + 0xaccf6200 ^ uVar3 * 0x21 + 0xe9f8cc1d) * 9 + 0xfd7046c5;
    seed = uVar3 >> 0x10 ^ uVar3 ^ 0xb55a4f09;
    this->m_state[lVar1] = seed ^ uVar2;
    lVar1 = lVar1 + 1;
  } while (lVar1 != 0x10);
  this->m_index = 0;
  return;
}

Assistant:

void well512::seed(uint32 seed) {
  uint32 jsr = utils::swap32(seed) ^ 0xAAC29377;

  for (uint i = 0; i < cStateSize; i++) {
    SHR3;
    seed = bitmix32c(seed);

    m_state[i] = seed ^ jsr;
  }
  m_index = 0;
}